

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_create_identity(REF_INTERP *ref_interp_ptr,REF_GRID to_grid)

{
  uint uVar1;
  long lVar2;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL max_error;
  REF_GRID pRStack_38;
  REF_INT node;
  REF_NODE to_node;
  REF_GRID from_grid;
  REF_INTERP ref_interp;
  REF_GRID to_grid_local;
  REF_INTERP *ref_interp_ptr_local;
  
  ref_interp = (REF_INTERP)to_grid;
  to_grid_local = (REF_GRID)ref_interp_ptr;
  uVar1 = ref_grid_deep_copy((REF_GRID *)&to_node,to_grid);
  if (uVar1 == 0) {
    uVar1 = ref_interp_create((REF_INTERP *)to_grid_local,(REF_GRID)to_node,(REF_GRID)ref_interp);
    if (uVar1 == 0) {
      from_grid = (REF_GRID)to_grid_local->mpi;
      pRStack_38 = ref_interp->from_grid;
      *(undefined4 *)((long)from_grid->cell + 0x24) = 1;
      for (max_error._4_4_ = 0; max_error._4_4_ < *(int *)((long)&pRStack_38->mpi + 4);
          max_error._4_4_ = max_error._4_4_ + 1) {
        if ((((-1 < max_error._4_4_) && (max_error._4_4_ < *(int *)((long)&pRStack_38->mpi + 4))) &&
            (-1 < *(long *)(&pRStack_38->cell[0]->type + (long)max_error._4_4_ * 2))) &&
           (pRStack_38->cell[8]->last_node_is_an_id == (&pRStack_38->cell[3]->type)[max_error._4_4_]
           )) {
          lVar2 = (long)(int)(&from_grid->cell[10]->type)[max_error._4_4_];
          if (lVar2 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x102,"ref_interp_create_identity","identity already found?",0xffffffffffffffff,
                   lVar2);
            return 1;
          }
          if (*(int *)&ref_interp[1].agent_hired == 0) {
            uVar1 = ref_interp_exhaustive_tet_around_node
                              ((REF_INTERP)from_grid,max_error._4_4_,
                               (REF_DBL *)
                               (&pRStack_38->cell[5]->type + (long)(max_error._4_4_ * 0xf) * 2),
                               (REF_INT *)(&from_grid->cell[10]->type + max_error._4_4_),
                               (REF_DBL *)
                               (&from_grid->cell[0xc]->type + (long)(max_error._4_4_ << 2) * 2));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x10c,"ref_interp_create_identity",(ulong)uVar1,"tet around node");
              return uVar1;
            }
          }
          else {
            uVar1 = ref_interp_exhaustive_tri_around_node
                              ((REF_INTERP)from_grid,max_error._4_4_,
                               (REF_DBL *)
                               (&pRStack_38->cell[5]->type + (long)(max_error._4_4_ * 0xf) * 2),
                               (REF_INT *)(&from_grid->cell[10]->type + max_error._4_4_),
                               (REF_DBL *)
                               (&from_grid->cell[0xc]->type + (long)(max_error._4_4_ << 2) * 2));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x107,"ref_interp_create_identity",(ulong)uVar1,"tri around node");
              return uVar1;
            }
          }
          (&from_grid->cell[0xb]->type)[max_error._4_4_] = *(REF_CELL_TYPE *)(*(long *)to_node + 4);
          if (((*(double *)(&from_grid->cell[0xc]->type + (long)(max_error._4_4_ << 2) * 2) <
                (double)from_grid->cell[0xd]) ||
              (*(double *)(&from_grid->cell[0xc]->size_per + (long)(max_error._4_4_ << 2) * 2) <
               (double)from_grid->cell[0xd])) ||
             ((*(double *)(&from_grid->cell[0xc]->edge_per + (long)(max_error._4_4_ << 2) * 2) <
               (double)from_grid->cell[0xd] ||
              ((double)(&from_grid->cell[0xc]->e2n)[max_error._4_4_ << 2] <
               (double)from_grid->cell[0xd])))) {
            printf("info bary %e %e %e %e identity tol\n",
                   *(undefined8 *)(&from_grid->cell[0xc]->type + (long)(max_error._4_4_ << 2) * 2),
                   *(undefined8 *)
                    (&from_grid->cell[0xc]->type + (long)(max_error._4_4_ * 4 + 1) * 2),
                   *(undefined8 *)
                    (&from_grid->cell[0xc]->type + (long)(max_error._4_4_ * 4 + 2) * 2),
                   *(undefined8 *)
                    (&from_grid->cell[0xc]->type + (long)(max_error._4_4_ * 4 + 3) * 2));
          }
        }
      }
      uVar1 = ref_interp_max_error((REF_INTERP)from_grid,(REF_DBL *)&ref_private_macro_code_rss_1);
      if (uVar1 == 0) {
        if ((ref_interp->ref_mpi->id == 0) && (1e-12 < _ref_private_macro_code_rss_1)) {
          printf("warning %e max error for identity background grid\n",_ref_private_macro_code_rss_1
                );
        }
        ref_interp_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x117,"ref_interp_create_identity",(ulong)uVar1,"max error");
        ref_interp_ptr_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xf9
             ,"ref_interp_create_identity",(ulong)uVar1,"create");
      ref_interp_ptr_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xf8,
           "ref_interp_create_identity",(ulong)uVar1,"import");
    ref_interp_ptr_local._4_4_ = uVar1;
  }
  return ref_interp_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_create_identity(REF_INTERP *ref_interp_ptr,
                                              REF_GRID to_grid) {
  REF_INTERP ref_interp;
  REF_GRID from_grid;
  REF_NODE to_node;
  REF_INT node;
  REF_DBL max_error;

  RSS(ref_grid_deep_copy(&from_grid, to_grid), "import");
  RSS(ref_interp_create(ref_interp_ptr, from_grid, to_grid), "create");

  ref_interp = *ref_interp_ptr;
  to_node = ref_grid_node(to_grid);

  ref_interp_continuously(ref_interp) = REF_TRUE;

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      REIS(REF_EMPTY, ref_interp->cell[node], "identity already found?");
      if (ref_grid_twod(to_grid)) {
        RSS(ref_interp_exhaustive_tri_around_node(
                ref_interp, node, ref_node_xyz_ptr(to_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "tri around node");
      } else {
        RSS(ref_interp_exhaustive_tet_around_node(
                ref_interp, node, ref_node_xyz_ptr(to_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "tet around node");
      }
      ref_interp->part[node] = ref_mpi_rank(ref_grid_mpi(from_grid));
      if (!ref_interp_bary_inside(ref_interp, &(ref_interp->bary[4 * node]))) {
        printf("info bary %e %e %e %e identity tol\n",
               ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node],
               ref_interp->bary[2 + 4 * node], ref_interp->bary[3 + 4 * node]);
      }
    }
  }

  RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
  if (ref_mpi_once(ref_grid_mpi(to_grid)) && max_error > 1.0e-12) {
    printf("warning %e max error for identity background grid\n", max_error);
  }

  return REF_SUCCESS;
}